

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analog.cpp
# Opt level: O3

void __thiscall E64::analog_ic::write_byte(analog_ic *this,uint8_t address,uint8_t byte)

{
  undefined1 uVar1;
  ushort uVar2;
  undefined3 in_register_00000031;
  
  switch(CONCAT31(in_register_00000031,address)) {
  case 0:
    this->waveform = (uint)(byte >> 4);
    this->gate_open = (bool)(byte & 1);
    this->pitch_bend_on = (bool)(byte >> 1 & 1);
    if ((byte & 4) != 0) {
      this->pitch_up = true;
      return;
    }
    this->pitch_up = false;
    return;
  case 1:
    this->pitch_factor = byte;
    return;
  case 2:
    uVar1 = (undefined1)this->digital_freq;
    this->digital_freq = CONCAT11(byte,uVar1);
    uVar2 = CONCAT11(byte,uVar1);
    break;
  case 3:
    uVar2 = CONCAT11(*(undefined1 *)((long)&this->digital_freq + 1),byte);
    this->digital_freq = uVar2;
    break;
  case 4:
    *(uint8_t *)((long)&this->square_duty + 1) = byte;
    return;
  case 5:
    *(uint8_t *)&this->square_duty = byte;
    return;
  case 6:
    *(uint8_t *)((long)&this->attack + 1) = byte;
    return;
  case 7:
    *(uint8_t *)&this->attack = byte;
    return;
  case 8:
    *(uint8_t *)((long)&this->decay + 1) = byte;
    return;
  case 9:
    *(uint8_t *)&this->decay = byte;
    return;
  case 10:
    *(uint8_t *)((long)&this->sustain + 1) = byte;
    return;
  case 0xb:
    *(uint8_t *)&this->sustain = byte;
    return;
  case 0xc:
    *(uint8_t *)((long)&this->release + 1) = byte;
    return;
  case 0xd:
    *(uint8_t *)&this->release = byte;
    return;
  case 0xe:
    *(uint8_t *)((long)&this->pitch_bend_duration + 1) = byte;
    return;
  case 0xf:
    *(uint8_t *)&this->pitch_bend_duration = byte;
  default:
    return;
  }
  this->frequency = (double)(uVar2 / 0x11);
  return;
}

Assistant:

void E64::analog_ic::write_byte(uint8_t address, uint8_t byte) {
	switch (address) {
		case 0x00:
			// TODO: situation 5 6 and 7
			waveform = (enum waveforms)(byte >> 4);
			(byte & 0b00000001) ? gate_open = true : gate_open = false;
			(byte & 0b00000010) ? pitch_bend_on = true : pitch_bend_on = false;
			(byte & 0b00000100) ? pitch_up = true : pitch_up = false;
			break;
		case 0x01:
			//pitch_factor = byte ? byte : 1;
			pitch_factor = byte;
			break;
		case 0x02:
			digital_freq = (byte << 8) | (digital_freq & 0xff);
			set_frequency();
			break;
		case 0x03:
			digital_freq = (digital_freq & 0xff00) | byte;
			set_frequency();
			break;
		case 0x04:
			square_duty = (byte << 8) | (square_duty & 0xff);
			break;
		case 0x05:
			square_duty = (square_duty & 0xff00) | byte;
			break;
		case 0x06:
			attack = (byte << 8) | (attack & 0xff);
			break;
		case 0x07:
			attack = (attack & 0xff00) | byte;
			break;
		case 0x08:
			decay = (byte << 8) | (decay & 0xff);
			break;
		case 0x09:
			decay = (decay & 0xff00) | byte;
			break;
		case 0x0a:
			sustain = (byte << 8) | (sustain & 0xff);
			break;
		case 0x0b:
			sustain = (sustain & 0xff00) | byte;
			break;
		case 0x0c:
			release = (byte << 8) | (release & 0xff);
			break;
		case 0x0d:
			release = (release & 0xff00) | byte;
			break;
		case 0x0e:
			pitch_bend_duration = (byte << 8) | (pitch_bend_duration & 0xff);
			break;
		case 0x0f:
			pitch_bend_duration = (pitch_bend_duration & 0xff00) | byte;
			break;
	}
}